

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void SingleTreeSearchHelper
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,ON_RTreePairSearchResult *a_result)

{
  bool bVar1;
  ON_RTreeBranch *pOVar2;
  ON_2dex *pOVar3;
  ON_2dex *r;
  ON_RTreeBranch *branchBmax;
  ON_RTreeBranch *branchB;
  ON_RTreePairSearchResult *a_result_local;
  ON_RTreeNode *a_nodeB_local;
  ON_RTreeBranch *a_branchA_local;
  
  branchBmax = a_nodeB->m_branch;
  pOVar2 = branchBmax + a_nodeB->m_count;
  if (a_nodeB->m_level < 1) {
    for (; branchBmax < pOVar2; branchBmax = branchBmax + 1) {
      if ((a_branchA < branchBmax) &&
         (bVar1 = PairSearchOverlapHelper
                            (&a_branchA->m_rect,&branchBmax->m_rect,a_result->m_tolerance), bVar1))
      {
        pOVar3 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
        pOVar3->i = (int)(a_branchA->field_1).m_id;
        pOVar3->j = (int)(branchBmax->field_1).m_id;
      }
    }
  }
  else {
    for (; branchBmax < pOVar2; branchBmax = branchBmax + 1) {
      bVar1 = PairSearchOverlapHelper(&a_branchA->m_rect,&branchBmax->m_rect,a_result->m_tolerance);
      if (bVar1) {
        SingleTreeSearchHelper(a_branchA,(branchBmax->field_1).m_child,a_result);
      }
    }
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;

  if (a_nodeB->m_level > 0)
  {
    // branchB's have children nodes and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
      {
        SingleTreeSearchHelper(a_branchA, branchB->m_child, a_result);
      }
      branchB++;
    }
  }
  else
  {
    // branchB's are leaves and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (a_branchA < branchB)
      {
        if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          ON_2dex& r = a_result->m_result->AppendNew();
          r.i = (int)a_branchA->m_id;
          r.j = (int)branchB->m_id;
        }
      }
      branchB++;
    }
  }
}